

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_decoder.c
# Opt level: O1

lzma_ret lzma_properties_decode
                   (lzma_filter *filter,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  lzma_ret lVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (*(lzma_vli *)((long)&decoders[0].id + lVar2) == filter->id) {
      lVar2 = (long)&decoders[0].id + lVar2;
      goto LAB_00196bc8;
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x120);
  lVar2 = 0;
LAB_00196bc8:
  filter->options = (void *)0x0;
  if (lVar2 == 0) {
    return LZMA_OPTIONS_ERROR;
  }
  if (*(code **)(lVar2 + 0x18) != (code *)0x0) {
    lVar1 = (**(code **)(lVar2 + 0x18))(&filter->options);
    return lVar1;
  }
  return (uint)(props_size != 0) << 3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_decode(lzma_filter *filter, lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	const lzma_filter_decoder *const fd = decoder_find(filter->id);

	// Make it always NULL so that the caller can always safely free() it.
	filter->options = NULL;

	if (fd == NULL)
		return LZMA_OPTIONS_ERROR;

	if (fd->props_decode == NULL)
		return props_size == 0 ? LZMA_OK : LZMA_OPTIONS_ERROR;

	return fd->props_decode(
			&filter->options, allocator, props, props_size);
}